

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest_StripSourceRetentionOneofOptions_Test
::TestBody(RetentionStripTest_StripSourceRetentionOneofOptions_Test *this)

{
  bool bVar1;
  FileDescriptor *this_00;
  Descriptor *pDVar2;
  MessageLite *pMVar3;
  OneofDescriptor *oneof;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar4;
  Message *output;
  char *pcVar5;
  string_view input;
  string_view data;
  string_view name;
  string_view name_00;
  string_view sVar6;
  string_view file_name;
  DynamicMessageFactory factory;
  OneofOptions expected_options;
  undefined1 local_450 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_448;
  OneofOptions local_440;
  undefined1 local_3f0 [144];
  RepeatedPtrFieldBase local_360 [4];
  OneofOptions local_2f8;
  OneofOptions local_2a8;
  OneofOptions local_258;
  OneofOptions local_208;
  OneofOptions local_1b8;
  OneofOptions local_168;
  OneofOptions local_118;
  OneofOptions local_c8;
  OneofOptions local_78;
  
  sVar6._M_str = 
  "\n      message TestMessage {\n        oneof test_oneof {\n        option (source_retention_option) = 123;\n        option (options) = {\n          i1: 123\n          i2: 456\n          c { s: \"abc\" }\n          rc { s: \"abc\" }\n        };\n        option (repeated_options) = {\n          i1: 111 i2: 222\n        };\n          string field1 = 1;\n          string field2 = 2;\n        };\n      }\n\n      message Options {\n        optional int32 i1 = 1 [retention = RETENTION_SOURCE];\n        optional int32 i2 = 2;\n        message ChildMessage {\n          optional string s = 1 [retention = RETENTION_SOURCE];\n        }\n        optional ChildMessage c = 3;\n        repeated ChildMessage rc = 4;\n      }\n\n      extend google.protobuf.OneofOptions {\n        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];\n        optional Options options = 50001;\n        repeated Options repeated_options = 50002;\n      }"
  ;
  sVar6._M_len = 0x399;
  file_name._M_str = "foo.proto";
  file_name._M_len = 9;
  output = (Message *)&DAT_00000009;
  this_00 = RetentionStripTest::ParseSchema(&this->super_RetentionStripTest,sVar6,file_name);
  OneofOptions::OneofOptions((OneofOptions *)local_3f0,(Arena *)0x0);
  sVar6 = MessageLite::GetTypeName((MessageLite *)local_3f0);
  pDVar2 = DescriptorPool::FindMessageTypeByName(&(this->super_RetentionStripTest).pool_,sVar6);
  OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)local_3f0);
  pMVar3 = &DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)local_3f0,pDVar2)->
            super_MessageLite;
  pMVar3 = MessageLite::New(pMVar3,(Arena *)0x0);
  input._M_str = (char *)pMVar3;
  input._M_len = (size_t)
                 "\n        [google.protobuf.internal.options] {\n          i2: 456\n          c {}\n          rc {}\n        }\n        [google.protobuf.internal.repeated_options] { i2: 222 }"
  ;
  bVar1 = TextFormat::ParseFromString((TextFormat *)0xa8,input,output);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x5f,"TextFormat::ParseFromString(data, dynamic_message.get())");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_440);
  }
  OneofOptions::OneofOptions(&local_2f8,(Arena *)0x0);
  MessageLite::SerializeAsString_abi_cxx11_((string *)&local_440,pMVar3);
  data._M_str = (char *)local_440.super_Message.super_MessageLite._vptr_MessageLite;
  data._M_len = local_440.super_Message.super_MessageLite._internal_metadata_.ptr_;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&local_2f8,data);
  if (bVar1) {
    if ((anon_union_64_1_493b367e_for_OneofOptions_3 *)
        local_440.super_Message.super_MessageLite._vptr_MessageLite != &local_440.field_0) {
      operator_delete(local_440.super_Message.super_MessageLite._vptr_MessageLite,
                      (ulong)((long)&((local_440.field_0._impl_._extensions_.arena_)->impl_).
                                     tag_and_id_ + 1));
    }
    (*pMVar3->_vptr_MessageLite[1])(pMVar3);
    DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)local_3f0);
    name._M_str = "TestMessage";
    name._M_len = 0xb;
    pDVar2 = FileDescriptor::FindMessageTypeByName(this_00,name);
    if (pDVar2 != (Descriptor *)0x0) {
      name_00._M_str = "test_oneof";
      name_00._M_len = 10;
      oneof = Descriptor::FindOneofByName(pDVar2,name_00);
      if (oneof != (OneofDescriptor *)0x0) {
        OneofOptions::OneofOptions(&local_1b8,(Arena *)0x0,&local_2f8);
        OneofOptions::OneofOptions((OneofOptions *)local_3f0,(Arena *)0x0,&local_1b8);
        OneofOptions::OneofOptions(&local_78,(Arena *)0x0,(OneofOptions *)local_3f0);
        OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
        OneofOptions::OneofOptions((OneofOptions *)local_3f0,(Arena *)0x0,&local_78);
        OneofOptions::OneofOptions(&local_440,(Arena *)0x0,(OneofOptions *)local_3f0);
        OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
        StripSourceRetentionOptions((FileDescriptorProto *)local_3f0,this_00,false);
        pVVar4 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           ((RepeatedPtrFieldBase *)(local_3f0 + 0x30),0);
        protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                  (&(pVVar4->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,0);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
        ::operator()(local_450,(char *)&local_440,
                     (OneofOptions *)
                     "StripSourceRetentionOptions(*file) .message_type(0) .oneof_decl(0) .options()"
                    );
        FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_3f0);
        OneofOptions::~OneofOptions(&local_440);
        OneofOptions::~OneofOptions(&local_78);
        OneofOptions::~OneofOptions(&local_1b8);
        if (local_450[0] == '\0') {
          testing::Message::Message((Message *)local_3f0);
          if (local_448._M_head_impl == (LogMessageData *)0x0) {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = (char *)((local_448._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_440,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                     ,0x200,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_440,(Message *)local_3f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_440);
          if ((_func_int **)local_3f0._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_3f0._0_8_ + 8))();
          }
        }
        if (local_448._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_448,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_448._M_head_impl);
        }
        OneofOptions::OneofOptions(&local_208,(Arena *)0x0,&local_2f8);
        OneofOptions::OneofOptions((OneofOptions *)local_3f0,(Arena *)0x0,&local_208);
        OneofOptions::OneofOptions(&local_c8,(Arena *)0x0,(OneofOptions *)local_3f0);
        OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
        OneofOptions::OneofOptions((OneofOptions *)local_3f0,(Arena *)0x0,&local_c8);
        OneofOptions::OneofOptions(&local_440,(Arena *)0x0,(OneofOptions *)local_3f0);
        OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
        StripSourceRetentionOptions((DescriptorProto *)local_3f0,pDVar2);
        protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                  (local_360,0);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
        ::operator()(local_450,(char *)&local_440,
                     (OneofOptions *)"StripSourceRetentionOptions(*message).oneof_decl(0).options()"
                    );
        DescriptorProto::~DescriptorProto((DescriptorProto *)local_3f0);
        OneofOptions::~OneofOptions(&local_440);
        OneofOptions::~OneofOptions(&local_c8);
        OneofOptions::~OneofOptions(&local_208);
        if (local_450[0] == '\0') {
          testing::Message::Message((Message *)local_3f0);
          if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )local_448._M_head_impl ==
              (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )0x0) {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = *(char **)local_448._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_440,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                     ,0x202,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_440,(Message *)local_3f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_440);
          if ((_func_int **)local_3f0._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_3f0._0_8_ + 8))();
          }
        }
        if (local_448._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_448,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_448._M_head_impl);
        }
        OneofOptions::OneofOptions(&local_258,(Arena *)0x0,&local_2f8);
        OneofOptions::OneofOptions((OneofOptions *)local_3f0,(Arena *)0x0,&local_258);
        OneofOptions::OneofOptions(&local_118,(Arena *)0x0,(OneofOptions *)local_3f0);
        OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
        OneofOptions::OneofOptions((OneofOptions *)local_3f0,(Arena *)0x0,&local_118);
        OneofOptions::OneofOptions(&local_440,(Arena *)0x0,(OneofOptions *)local_3f0);
        OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
        StripSourceRetentionOptions((OneofDescriptorProto *)local_3f0,oneof);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
        ::operator()(local_450,(char *)&local_440,
                     (OneofOptions *)"StripSourceRetentionOptions(*oneof).options()");
        OneofDescriptorProto::~OneofDescriptorProto((OneofDescriptorProto *)local_3f0);
        OneofOptions::~OneofOptions(&local_440);
        OneofOptions::~OneofOptions(&local_118);
        OneofOptions::~OneofOptions(&local_258);
        if (local_450[0] == '\0') {
          testing::Message::Message((Message *)local_3f0);
          if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )local_448._M_head_impl ==
              (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )0x0) {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = *(char **)local_448._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_440,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                     ,0x204,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_440,(Message *)local_3f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_440);
          if ((_func_int **)local_3f0._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_3f0._0_8_ + 8))();
          }
        }
        if (local_448._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_448,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_448._M_head_impl);
        }
        OneofOptions::OneofOptions(&local_2a8,(Arena *)0x0,&local_2f8);
        OneofOptions::OneofOptions((OneofOptions *)local_3f0,(Arena *)0x0,&local_2a8);
        OneofOptions::OneofOptions(&local_168,(Arena *)0x0,(OneofOptions *)local_3f0);
        OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
        OneofOptions::OneofOptions((OneofOptions *)local_3f0,(Arena *)0x0,&local_168);
        OneofOptions::OneofOptions(&local_440,(Arena *)0x0,(OneofOptions *)local_3f0);
        OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
        StripLocalSourceRetentionOptions((OneofOptions *)local_3f0,oneof);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
        ::operator()(local_450,(char *)&local_440,
                     (OneofOptions *)"StripLocalSourceRetentionOptions(*oneof)");
        OneofOptions::~OneofOptions((OneofOptions *)local_3f0);
        OneofOptions::~OneofOptions(&local_440);
        OneofOptions::~OneofOptions(&local_168);
        OneofOptions::~OneofOptions(&local_2a8);
        if (local_450[0] == '\0') {
          testing::Message::Message((Message *)local_3f0);
          if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               )local_448._M_head_impl ==
              (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               )0x0) {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = (char *)((local_448._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_440,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                     ,0x206,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_440,(Message *)local_3f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_440);
          if ((_func_int **)local_3f0._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_3f0._0_8_ + 8))();
          }
        }
        if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             )local_448._M_head_impl !=
            (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
            0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_448,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_448._M_head_impl);
        }
        OneofOptions::~OneofOptions(&local_2f8);
        return;
      }
      absl::lts_20250127::log_internal::DieBecauseNull
                ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                 ,0x1fa,"message->FindOneofByName(\"test_oneof\")");
    }
    absl::lts_20250127::log_internal::DieBecauseNull
              ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x1f8,"file->FindMessageTypeByName(\"TestMessage\")");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_450,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
             ,0x61,"ret.ParseFromString(dynamic_message->SerializeAsString())");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_450);
}

Assistant:

TEST_F(RetentionStripTest, StripSourceRetentionOneofOptions) {
  const FileDescriptor* file = ParseSchema(R"schema(
      message TestMessage {
        oneof test_oneof {
        option (source_retention_option) = 123;
        option (options) = {
          i1: 123
          i2: 456
          c { s: "abc" }
          rc { s: "abc" }
        };
        option (repeated_options) = {
          i1: 111 i2: 222
        };
          string field1 = 1;
          string field2 = 2;
        };
      }

      message Options {
        optional int32 i1 = 1 [retention = RETENTION_SOURCE];
        optional int32 i2 = 2;
        message ChildMessage {
          optional string s = 1 [retention = RETENTION_SOURCE];
        }
        optional ChildMessage c = 3;
        repeated ChildMessage rc = 4;
      }

      extend google.protobuf.OneofOptions {
        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];
        optional Options options = 50001;
        repeated Options repeated_options = 50002;
      })schema");

  OneofOptions expected_options = BuildDynamicProto<OneofOptions>(
      R"pb(
        [google.protobuf.internal.options] {
          i2: 456
          c {}
          rc {}
        }
        [google.protobuf.internal.repeated_options] { i2: 222 })pb");
  const Descriptor* message =
      ABSL_DIE_IF_NULL(file->FindMessageTypeByName("TestMessage"));
  const OneofDescriptor* oneof =
      ABSL_DIE_IF_NULL(message->FindOneofByName("test_oneof"));

  EXPECT_THAT(StripSourceRetentionOptions(*file)
                  .message_type(0)
                  .oneof_decl(0)
                  .options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*message).oneof_decl(0).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*oneof).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripLocalSourceRetentionOptions(*oneof),
              EqualsProto(expected_options));
}